

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O1

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::jsonpointer::
safe_unflatten<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
          (jsonpointer *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *value
          )

{
  bool bVar1;
  bool bVar2;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this_00;
  bool bVar3;
  size_t n_00;
  void *pvVar4;
  iterator value_00;
  bool bVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  byte bVar7;
  __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  _Var8;
  long lVar9;
  value_type *args;
  bool bVar10;
  type tVar11;
  array_range_type aVar12;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar13;
  size_t n;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  local_98;
  object_range_type local_80;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *local_60;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_58;
  string_view_type local_50;
  jsonpointer local_40 [16];
  
  bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object(value);
  if ((!bVar3) ||
     (bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::empty(value), bVar3)
     ) {
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,value);
    uVar6 = extraout_RDX;
  }
  else {
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
              (&local_80,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)value);
    bVar2 = local_80.last_.has_value_;
    bVar1 = local_80.first_.has_value_;
    bVar7 = local_80.first_.has_value_ & local_80.last_.has_value_;
    local_58 = local_80.last_.it_._M_current;
    bVar10 = local_80.first_.it_._M_current == local_80.last_.it_._M_current;
    bVar3 = local_80.first_.has_value_ == local_80.last_.has_value_;
    if ((bVar7 & 1) != 0) {
      bVar3 = bVar10;
    }
    if (!bVar3) {
      bVar3 = true;
      lVar9 = 0;
      _Var8._M_current = local_80.first_.it_._M_current;
      local_60 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)value;
      do {
        tVar11 = jsoncons::detail::dec_to_integer<unsigned_long,char>
                           (*(detail **)&(_Var8._M_current)->key_,
                            (char *)(((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
                                       *)&(_Var8._M_current)->key_)->long_str_).ptr_,
                            (size_t)&local_98,(unsigned_long *)(ulong)bVar10);
        this_00 = local_60;
        bVar5 = false;
        if (lVar9 != CONCAT62(local_98._2_6_,local_98.common_)) {
          bVar3 = false;
        }
        if ((tVar11.ec != success) ||
           (bVar5 = bVar3, lVar9 != CONCAT62(local_98._2_6_,local_98.common_))) break;
        lVar9 = lVar9 + 1;
        _Var8._M_current = _Var8._M_current + 1;
        bVar10 = _Var8._M_current == local_58;
        if ((bVar7 & 1) == 0) {
          bVar10 = bVar1 == bVar2;
        }
      } while (bVar10 != true);
      value = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_60;
      if (!bVar5) {
        pvVar4 = operator_new(0x20);
        *(undefined8 *)((long)pvVar4 + 8) = 0;
        *(undefined8 *)((long)pvVar4 + 0x10) = 0;
        *(undefined8 *)((long)pvVar4 + 0x18) = 0;
        *(undefined2 *)this = 0xd;
        *(void **)(this + 8) = pvVar4;
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
                  (&local_80,this_00);
        bVar3 = local_80.first_.has_value_ == local_80.last_.has_value_;
        if ((local_80.first_.has_value_ & local_80.last_.has_value_ & 1U) != 0) {
          bVar3 = local_80.first_.it_._M_current == local_80.last_.it_._M_current;
        }
        uVar6 = extraout_RDX_01;
        if (!bVar3) {
          _Var8._M_current = local_80.first_.it_._M_current;
          do {
            local_50._M_str = *(char **)&(_Var8._M_current)->key_;
            local_50._M_len =
                 (((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
                    *)&(_Var8._M_current)->key_)->int64_).val_;
            safe_unflatten<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                      (local_40,&(_Var8._M_current)->value_);
            basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
            try_emplace<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                      ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                        *)&local_98.common_,
                       (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)this,
                       &local_50,
                       (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_40)
            ;
            basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)local_40)
            ;
            _Var8._M_current = _Var8._M_current + 1;
            bVar3 = _Var8._M_current == local_80.last_.it_._M_current;
            if ((local_80.first_.has_value_ & local_80.last_.has_value_ & 1U) == 0) {
              bVar3 = local_80.first_.has_value_ == local_80.last_.has_value_;
            }
            uVar6 = extraout_RDX_02;
          } while (!bVar3);
        }
        goto LAB_00459a3f;
      }
    }
    local_98.long_str_.ptr_ = (pointer)operator_new(0x20);
    *(undefined8 *)
     &(((pointer)local_98.long_str_.ptr_)->
      super_heap_string_base<unsigned_long,_std::allocator<char>_>).field_0x8 = 0;
    ((pointer)local_98.long_str_.ptr_)->p_ = (pointer)0x0;
    (local_98.byte_str_.ptr_)->length_ = 0;
    local_98.common_ = (common_storage)0xe;
    n_00 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(value);
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::reserve
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&local_98.common_
               ,n_00);
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
              (&local_80,(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)value);
    bVar3 = local_80.first_.has_value_ == local_80.last_.has_value_;
    if ((local_80.first_.has_value_ & local_80.last_.has_value_ & 1U) != 0) {
      bVar3 = local_80.first_.it_._M_current == local_80.last_.it_._M_current;
    }
    if (!bVar3) {
      args = &(local_80.first_.it_._M_current)->value_;
      do {
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
        emplace_back<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                  ((basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
                   &local_98.common_,args);
        bVar3 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *)(args + 1) == local_80.last_.it_._M_current;
        if ((local_80.first_.has_value_ & local_80.last_.has_value_ & 1U) == 0) {
          bVar3 = local_80.first_.has_value_ == local_80.last_.has_value_;
        }
        args = args + 3;
      } while (!bVar3);
    }
    pvVar4 = operator_new(0x20);
    *(undefined8 *)((long)pvVar4 + 8) = 0;
    *(undefined8 *)((long)pvVar4 + 0x10) = 0;
    *(undefined8 *)((long)pvVar4 + 0x18) = 0;
    *(undefined2 *)this = 0xe;
    *(void **)(this + 8) = pvVar4;
    aVar12 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                       ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                        &local_98.common_);
    value_00 = aVar12.first_._M_current;
    if (value_00._M_current != aVar12.last_._M_current._M_current) {
      do {
        safe_unflatten<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                  ((jsonpointer *)&local_80,value_00._M_current);
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
        emplace_back<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                  ((basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)this,
                   (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&local_80);
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&local_80);
        value_00._M_current = value_00._M_current + 1;
      } while (value_00._M_current != aVar12.last_._M_current._M_current);
    }
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&local_98.common_
              );
    uVar6 = extraout_RDX_00;
  }
LAB_00459a3f:
  bVar13.field_0.int64_.val_ = uVar6;
  bVar13.field_0._0_8_ = this;
  return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar13.field_0;
}

Assistant:

Json safe_unflatten (Json& value)
    {
        if (!value.is_object() || value.empty())
        {
            return value;
        }
        bool safe = true;
        std::size_t index = 0;
        for (const auto& item : value.object_range())
        {
            std::size_t n;
            auto r = jsoncons::detail::dec_to_integer(item.key().data(),item.key().size(), n);
            if (!r || (index++ != n))
            {
                safe = false;
                break;
            }
        }

        if (safe)
        {
            Json j(json_array_arg);
            j.reserve(value.size());
            for (auto& item : value.object_range())
            {
                j.emplace_back(std::move(item.value()));
            }
            Json a(json_array_arg);
            for (auto& item : j.array_range())
            {
                a.emplace_back(safe_unflatten (item));
            }
            return a;
        }
        else
        {
            Json o(json_object_arg);
            for (auto& item : value.object_range())
            {
                o.try_emplace(item.key(), safe_unflatten (item.value()));
            }
            return o;
        }
    }